

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O0

void __thiscall
OpenMD::StuntDouble::combineForcesAndTorques
          (StuntDouble *this,Snapshot *snapA,Snapshot *snapB,RealType multA,RealType multB)

{
  uint uVar1;
  Snapshot *pSVar2;
  reference pvVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double in_XMM1_Qa;
  RealType sitePotentialB;
  RealType sitePotentialA;
  Vector3d electricFieldB;
  Vector3d electricFieldA;
  RealType flucQFrcB;
  RealType flucQFrcA;
  RealType particlePotB;
  RealType particlePotA;
  Vector3d torqueB;
  Vector3d torqueA;
  Vector3d forceB;
  Vector3d forceA;
  int sl;
  Vector3<double> *in_stack_fffffffffffffe18;
  Vector<double,_3U> *in_stack_fffffffffffffe20;
  Vector<double,_3U> *in_stack_fffffffffffffe28;
  
  pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
  uVar1 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(pSVar2->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)));
  if ((uVar1 & 4) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RSI + *(long *)(in_RDI + 0x10) + 0x30),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDX + *(long *)(in_RDI + 0x10) + 0x30),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               ((long)&(pSVar2->atomData).force.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
               (long)*(int *)(in_RDI + 0x30));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  }
  if ((uVar1 & 0x20) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RSI + *(long *)(in_RDI + 0x10) + 0x78),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDX + *(long *)(in_RDI + 0x10) + 0x78),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               ((long)&(pSVar2->atomData).torque.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
               (long)*(int *)(in_RDI + 0x30));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  }
  if ((uVar1 & 0x40) != 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RSI + *(long *)(in_RDI + 0x10) + 0x90),(long)*(int *)(in_RDI + 0x30));
    dVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RDX + *(long *)(in_RDI + 0x10) + 0x90),(long)*(int *)(in_RDI + 0x30));
    in_stack_fffffffffffffe28 = (Vector<double,_3U> *)(in_XMM0_Qa * dVar4 + in_XMM1_Qa * *pvVar3);
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        ((long)&(pSVar2->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
                        (long)*(int *)(in_RDI + 0x30));
    *pvVar3 = (value_type)in_stack_fffffffffffffe28;
  }
  if ((uVar1 & 0x10000) != 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RSI + *(long *)(in_RDI + 0x10) + 0x180),(long)*(int *)(in_RDI + 0x30));
    dVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RDX + *(long *)(in_RDI + 0x10) + 0x180),(long)*(int *)(in_RDI + 0x30));
    in_stack_fffffffffffffe20 = (Vector<double,_3U> *)(in_XMM0_Qa * dVar4 + in_XMM1_Qa * *pvVar3);
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        ((long)&(pSVar2->atomData).flucQFrc.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
                        (long)*(int *)(in_RDI + 0x30));
    *pvVar3 = (value_type)in_stack_fffffffffffffe20;
  }
  if ((uVar1 & 0x1000) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RSI + *(long *)(in_RDI + 0x10) + 0x120),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDX + *(long *)(in_RDI + 0x10) + 0x120),(long)*(int *)(in_RDI + 0x30));
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18)
    ;
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator*((double)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    OpenMD::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               ((long)&(pSVar2->atomData).electricField.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
               (long)*(int *)(in_RDI + 0x30));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  }
  if ((uVar1 & 0x20000) != 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RSI + *(long *)(in_RDI + 0x10) + 0x198),(long)*(int *)(in_RDI + 0x30));
    dVar4 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (in_RDX + *(long *)(in_RDI + 0x10) + 0x198),(long)*(int *)(in_RDI + 0x30));
    dVar4 = in_XMM0_Qa * dVar4 + in_XMM1_Qa * *pvVar3;
    pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        ((long)&(pSVar2->atomData).sitePotential.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
                        (long)*(int *)(in_RDI + 0x30));
    *pvVar3 = dVar4;
  }
  return;
}

Assistant:

void StuntDouble::combineForcesAndTorques(Snapshot* snapA, Snapshot* snapB,
                                            RealType multA, RealType multB) {
    int sl = (snapshotMan_->getCurrentSnapshot()->*storage_).getStorageLayout();

    assert(sl == (snapA->*storage_).getStorageLayout());
    assert(sl == (snapB->*storage_).getStorageLayout());

    if (sl & DataStorage::dslForce) {
      Vector3d forceA = (snapA->*storage_).force[localIndex_];
      Vector3d forceB = (snapB->*storage_).force[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).force[localIndex_] =
          multA * forceA + multB * forceB;
    }

    if (sl & DataStorage::dslTorque) {
      Vector3d torqueA = (snapA->*storage_).torque[localIndex_];
      Vector3d torqueB = (snapB->*storage_).torque[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).torque[localIndex_] =
          multA * torqueA + multB * torqueB;
    }

    if (sl & DataStorage::dslParticlePot) {
      RealType particlePotA = (snapA->*storage_).particlePot[localIndex_];
      RealType particlePotB = (snapB->*storage_).particlePot[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .particlePot[localIndex_] =
          multA * particlePotA + multB * particlePotB;
    }

    if (sl & DataStorage::dslFlucQForce) {
      RealType flucQFrcA = (snapA->*storage_).flucQFrc[localIndex_];
      RealType flucQFrcB = (snapB->*storage_).flucQFrc[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).flucQFrc[localIndex_] =
          multA * flucQFrcA + multB * flucQFrcB;
    }

    if (sl & DataStorage::dslElectricField) {
      Vector3d electricFieldA = (snapA->*storage_).electricField[localIndex_];
      Vector3d electricFieldB = (snapB->*storage_).electricField[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .electricField[localIndex_] =
          multA * electricFieldA + multB * electricFieldB;
    }

    if (sl & DataStorage::dslSitePotential) {
      RealType sitePotentialA = (snapA->*storage_).sitePotential[localIndex_];
      RealType sitePotentialB = (snapB->*storage_).sitePotential[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .sitePotential[localIndex_] =
          multA * sitePotentialA + multB * sitePotentialB;
    }
  }